

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

string * __thiscall
tinyformat::format<signed_char*>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,char **args)

{
  ostringstream oss;
  FormatArg local_1b0;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1b0.m_formatImpl = detail::FormatArg::formatImpl<signed_char*>;
  local_1b0.m_toIntImpl = detail::FormatArg::toIntImpl<signed_char*>;
  local_1b0.m_value = fmt;
  detail::formatImpl((ostream *)local_198,(char *)this,&local_1b0,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}